

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

full_frame * search_until_work_found_or_done(__cilkrts_worker *w)

{
  schedule_t sVar1;
  long in_RDI;
  full_frame *ff;
  __cilkrts_worker *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  full_frame *local_18;
  
  local_18 = (full_frame *)0x0;
  while( true ) {
    while( true ) {
      if (local_18 != (full_frame *)0x0) {
        return local_18;
      }
      sVar1 = worker_runnable(in_stack_ffffffffffffffd8);
      if (sVar1 != SCHEDULE_RUN) break;
      local_18 = check_for_work((__cilkrts_worker *)(ulong)in_stack_ffffffffffffffe0);
    }
    if (sVar1 != SCHEDULE_WAIT) {
      if (sVar1 != SCHEDULE_EXIT) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                      ,0x744,"0");
      }
      if (*(int *)(*(long *)(in_RDI + 0x38) + 0x88) != 2) {
        return (full_frame *)0x0;
      }
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0x741,"WORKER_USER != w->l->type");
    }
    if (*(int *)(*(long *)(in_RDI + 0x38) + 0x88) != 1) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0x734,"WORKER_SYSTEM == w->l->type");
    }
    if (*(long *)(*(long *)(in_RDI + 0x38) + 0x38) != 0) break;
    notify_children_wait((__cilkrts_worker *)0x11683c);
    signal_node_wait((signal_node_t *)0x116851);
    notify_children_run((__cilkrts_worker *)0x11685b);
    *(undefined4 *)(*(long *)(in_RDI + 0x38) + 0x1a0) = 0;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,0x737,"NULL == w->l->next_frame_ff");
}

Assistant:

static full_frame* search_until_work_found_or_done(__cilkrts_worker *w)
{
    full_frame *ff = NULL;
    // Find a full frame to execute (either through random stealing,
    // or because we pull it off w's 1-element queue).
    while (!ff) {
        // Check worker state to figure out our next action.
        switch (worker_runnable(w))    
        {
        case SCHEDULE_RUN:             // One attempt at checking for work.
            ff = check_for_work(w);
            break;
        case SCHEDULE_WAIT:            // go into wait-mode.
            START_INTERVAL(w, INTERVAL_SCHEDULE_WAIT);
            CILK_ASSERT(WORKER_SYSTEM == w->l->type);
            // If we are about to wait, then we better not have
            // a frame that we should execute...
            CILK_ASSERT(NULL == w->l->next_frame_ff);
            notify_children_wait(w);
            signal_node_wait(w->l->signal_node);
            // ...
            // Runtime is waking up.
            notify_children_run(w);
            w->l->steal_failure_count = 0;
            STOP_INTERVAL(w, INTERVAL_SCHEDULE_WAIT);
            break;
        case SCHEDULE_EXIT:            // exit the scheduler.
            CILK_ASSERT(WORKER_USER != w->l->type);
            return NULL;
        default:
            CILK_ASSERT(0);
            abort();
        }
    }
    return ff;
}